

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

void loguru::write_hex_digit(string *out,uint num)

{
  void *pvVar1;
  undefined8 local_40;
  Text str_right;
  Text fail_info;
  Text str_left;
  
  if ((uint)out < 0x10) {
    std::__cxx11::string::push_back('(');
    return;
  }
  textprintf((char *)&fail_info,"%u");
  textprintf((char *)&local_40,"%u",0x10);
  textprintf((char *)&str_right,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","num","<","16u",
             fail_info._str,"<",local_40);
  pvVar1 = calloc(1,1);
  log_and_abort(0,str_right._str,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ss16118[P]kapsel/libs/loguru/loguru.cpp"
                ,0x216,"%s",pvVar1);
}

Assistant:

static void write_hex_digit(std::string& out, unsigned num)
	{
		DCHECK_LT_F(num, 16u);
		if (num < 10u) { out.push_back(char('0' + num)); }
		else { out.push_back(char('A' + num - 10)); }
	}